

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

qreal __thiscall
QScrollerPrivate::scrollingSegmentsEndPos(QScrollerPrivate *this,Orientation orientation)

{
  long lVar1;
  ScrollSegment *pSVar2;
  
  if (orientation == Horizontal) {
    lVar1 = (this->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size;
    if (lVar1 == 0) {
      return (this->contentPosition).xp + (this->overshootPosition).xp;
    }
    pSVar2 = (this->xSegments).super_QList<QScrollerPrivate::ScrollSegment>.d.ptr;
  }
  else {
    lVar1 = (this->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.size;
    if (lVar1 == 0) {
      return (this->contentPosition).yp + (this->overshootPosition).yp;
    }
    pSVar2 = (this->ySegments).super_QList<QScrollerPrivate::ScrollSegment>.d.ptr;
  }
  return pSVar2[lVar1 + -1].stopPos;
}

Assistant:

qreal QScrollerPrivate::scrollingSegmentsEndPos(Qt::Orientation orientation) const
{
    if (orientation == Qt::Horizontal) {
        if (xSegments.isEmpty())
            return contentPosition.x() + overshootPosition.x();
        else
            return xSegments.last().stopPos;
    } else {
        if (ySegments.isEmpty())
            return contentPosition.y() + overshootPosition.y();
        else
            return ySegments.last().stopPos;
    }
}